

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void get_supertiles(tgestate_t *state)

{
  byte bVar1;
  tgestate_t *in_RDI;
  uint8_t *buf;
  uint8_t iters;
  supertileindex_t *tiles;
  uint8_t v;
  supertileindex_t *local_28;
  char local_19;
  uint8_t *local_18;
  
  bVar1 = (in_RDI->map_position).y & 0xfc;
  local_18 = mask_radio +
             (long)((int)(uint)(in_RDI->map_position).x >> 2) +
             (long)(int)(((uint)bVar1 + ((int)(uint)bVar1 >> 1)) * 9) + 10;
  local_19 = (char)in_RDI->st_rows;
  if ("" < local_18 + (long)in_RDI->st_columns + (long)((in_RDI->st_rows + -1) * 0x36)) {
    local_19 = local_19 + -1;
  }
  local_28 = in_RDI->map_buf;
  do {
    memcpy(local_28,local_18,(long)in_RDI->st_columns);
    local_28 = local_28 + in_RDI->st_columns;
    local_18 = local_18 + 0x36;
    local_19 = local_19 + -1;
  } while (local_19 != '\0');
  check_map_buf(in_RDI);
  return;
}

Assistant:

void get_supertiles(tgestate_t *state)
{
  uint8_t                 v;     /* was A */
  const supertileindex_t *tiles; /* was HL */
  uint8_t                 iters; /* was A */
  uint8_t                *buf;   /* was DE */

  assert(state != NULL);

  /* Get vertical offset. */
  v = state->map_position.y & ~3; /* = 0, 4, 8, 12, ... */

  /* Multiply 'v' by (MAPX / 4) (= 13.5 = 1.5 * 9).
   * 'v' is a multiple of 4, so this goes 0, 54, 108, 162, ...)
   * MAPX is subtracted to skip the first row. */
  tiles = &map[0] - MAPX + (v + (v >> 1)) * 9;

  /* Add horizontal offset. */
  tiles += state->map_position.x >> 2;

  iters = state->st_rows;
  /* Conv: Avoid reading outside the map bounds. */
  if ((tiles + ((state->st_rows - 1) * MAPX) + state->st_columns) > &map[MAPX * MAPY])
    iters--;

  /* Populate map_buf with 7x5 array of supertile refs. */
  buf = &state->map_buf[0];
  do
  {
    ASSERT_MAP_PTR_VALID(tiles);
    memcpy(buf, tiles, state->st_columns);
    buf   += state->st_columns;
    tiles += MAPX;
  }
  while (--iters);

  check_map_buf(state);
}